

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,std::allocator<pstore::repo::linked_definitions::value_type>>>>,std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,std::allocator<pstore::repo::linked_definitions::value_type>>>*>
          (rule *this,
          back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>
          *args)

{
  iterator *piVar1;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  rule *prVar5;
  ulong uVar6;
  pointer __p;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_40;
  _Head_base<0UL,_pstore::exchange::import_ns::linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>_*,_false>
  local_38;
  not_null<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_*>
  local_30;
  
  pcVar2 = (this->context_).ptr_;
  prVar5 = (rule *)operator_new(0x48);
  local_30.ptr_ = args;
  gsl::
  not_null<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_*>
  ::ensure_invariant(&local_30);
  (prVar5->context_).ptr_ = pcVar2;
  prVar5->_vptr_rule = (_func_int **)&PTR__linked_definition_0023c030;
  prVar5[1]._vptr_rule = (_func_int **)local_30.ptr_;
  prVar5[1].context_.ptr_ = (context *)0x0;
  prVar5[2]._vptr_rule = (_func_int **)(prVar5 + 3);
  prVar5[2].context_.ptr_ = (context *)0x0;
  *(undefined1 *)&prVar5[3]._vptr_rule = 0;
  prVar5[4]._vptr_rule = (_func_int **)0x0;
  local_38._M_head_impl =
       (linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>
        *)0x0;
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    local_40._M_head_impl = prVar5;
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_40);
    if (local_40._M_head_impl != (rule *)0x0) {
      (*(local_40._M_head_impl)->_vptr_rule[1])();
    }
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl = prVar5;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  local_40._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definition<std::back_insert_iterator<std::vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>_>_>_>_>
                 *)&local_38);
  log_top(this,true);
  uVar6 = std::_V2::system_category();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }